

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Descriptor.cpp
# Opt level: O3

TypeDescriptor * divOperator(TypeDescriptor *leftValue,TypeDescriptor *rightValue)

{
  pointer pcVar1;
  types tVar2;
  NumberDescriptor *this;
  ostream *poVar3;
  long *local_70;
  long local_68;
  long local_60 [2];
  long *local_50;
  long local_48;
  long local_40 [2];
  
  if (leftValue->_type == NUMBER) {
    tVar2 = rightValue->_type;
    if (tVar2 == NUMBER) {
      this = (NumberDescriptor *)operator_new(0x60);
      NumberDescriptor::NumberDescriptor(this,leftValue->_number / rightValue->_number);
      return &this->super_TypeDescriptor;
    }
LAB_00114b05:
    if (tVar2 != STRING) {
      poVar3 = std::operator<<((ostream *)&std::cout,"Unknown type. Terminating...");
      std::endl<char,std::char_traits<char>>(poVar3);
      goto LAB_00114c9a;
    }
  }
  else if (leftValue->_type != STRING) {
    tVar2 = rightValue->_type;
    goto LAB_00114b05;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"TypeDescriptor *divOperator: ",0x1d);
  pcVar1 = (leftValue->_string)._M_dataplus._M_p;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + (leftValue->_string)._M_string_length);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_50,local_48);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," / ",3);
  pcVar1 = (rightValue->_string)._M_dataplus._M_p;
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + (rightValue->_string)._M_string_length);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_70,local_68);
  std::endl<char,std::char_traits<char>>(poVar3);
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Cannot divide:",0xe);
  pcVar1 = (leftValue->_string)._M_dataplus._M_p;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + (leftValue->_string)._M_string_length);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_50,local_48);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," / ",3);
  pcVar1 = (rightValue->_string)._M_dataplus._M_p;
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + (rightValue->_string)._M_string_length);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_70,local_68);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
LAB_00114c9a:
  exit(2);
}

Assistant:

TypeDescriptor *divOperator(TypeDescriptor *leftValue, TypeDescriptor *rightValue){
    if(leftValue->type() == TypeDescriptor::NUMBER
    && rightValue->type() == TypeDescriptor::NUMBER){
        auto *numSum = new  NumberDescriptor(leftValue->getNumber() / rightValue->getNumber());
        //std::cout << "TypeDescriptor *divOperator: " << leftValue->getNumber() << " / " << rightValue->getNumber() << std::endl;
        return numSum;
    }else if(leftValue->type() == TypeDescriptor::STRING
    || rightValue->type() == TypeDescriptor::STRING){
        std::cout << "TypeDescriptor *divOperator: " << leftValue->getString()  << " / " << rightValue->getString()  << std::endl;
        std::cout << "Cannot divide:" << leftValue->getString()  << " / " << rightValue->getString()  << std::endl;
        exit(2);
    }else{
        std::cout << "Unknown type. Terminating..." << std::endl;
        exit(2);
    }
}